

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

SUNErrCode
AndersonAccelerate(SUNNonlinearSolver NLS,N_Vector gval,N_Vector x,N_Vector xold,int iter)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  double *pdVar13;
  long lVar14;
  undefined8 uVar15;
  int iVar16;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  int in_R8D;
  double dVar17;
  double dVar18;
  double dVar19;
  int damping;
  N_Vector *Xvecs;
  N_Vector *Q;
  N_Vector *dg;
  N_Vector *df;
  N_Vector fold;
  N_Vector gold;
  N_Vector vtemp;
  N_Vector fv;
  sunrealtype *gamma;
  sunrealtype *R;
  sunrealtype *cvals;
  sunrealtype onembeta;
  sunrealtype beta;
  sunrealtype s;
  sunrealtype c;
  sunrealtype rtemp;
  sunrealtype b;
  sunrealtype a;
  int *ipt_map;
  int maa;
  int lAA;
  int j;
  int i;
  int i_pt;
  int nvec;
  SUNContext_conflict sunctx_local_scope_;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  
  puVar5 = *(undefined4 **)(*in_RDI + 0x18);
  iVar3 = *(int *)(*in_RDI + 0x10);
  uVar6 = *(undefined8 *)(*in_RDI + 0x80);
  uVar7 = *(undefined8 *)(*in_RDI + 0x78);
  lVar8 = *(long *)(*in_RDI + 0x48);
  lVar9 = *(long *)(*in_RDI + 0x50);
  lVar10 = *(long *)(*in_RDI + 0x58);
  puVar11 = *(undefined8 **)(*in_RDI + 0x40);
  puVar12 = *(undefined8 **)(*in_RDI + 0x60);
  pdVar13 = *(double **)(*in_RDI + 0x30);
  lVar14 = *(long *)(*in_RDI + 0x38);
  uVar15 = *(undefined8 *)(*in_RDI + 0x88);
  iVar4 = *(int *)(*in_RDI + 0x20);
  dVar19 = *(double *)(*in_RDI + 0x28);
  for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
    puVar5[local_44] = 0;
  }
  iVar16 = (in_R8D + -1) - ((in_R8D + -1) / iVar3) * iVar3;
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RSI,in_RCX,uVar15);
  if (0 < in_R8D) {
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RSI,uVar6,
                 *(undefined8 *)(lVar9 + (long)iVar16 * 8));
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,uVar15,uVar7,
                 *(undefined8 *)(lVar8 + (long)iVar16 * 8));
  }
  N_VScale(0x3ff0000000000000,in_RSI,uVar6);
  N_VScale(0x3ff0000000000000,uVar15,uVar7);
  if (in_R8D == 0) {
    N_VScale(0x3ff0000000000000,in_RSI,in_RDX);
  }
  else {
    if (in_R8D == 1) {
      dVar17 = (double)N_VDotProd(*(undefined8 *)(lVar8 + (long)iVar16 * 8),
                                  *(undefined8 *)(lVar8 + (long)iVar16 * 8));
      *pdVar13 = dVar17;
      if (0.0 < *pdVar13) {
        local_f8 = sqrt(*pdVar13);
      }
      else {
        local_f8 = 0.0;
      }
      *pdVar13 = local_f8;
      N_VScale(1.0 / *pdVar13,*(undefined8 *)(lVar8 + (long)iVar16 * 8),
               *(undefined8 *)(lVar10 + (long)iVar16 * 8));
      *puVar5 = 0;
    }
    else if (iVar3 < in_R8D) {
      for (local_44 = 0; local_44 < iVar3 + -1; local_44 = local_44 + 1) {
        dVar17 = pdVar13[(local_44 + 1) * iVar3 + local_44];
        dVar18 = pdVar13[(local_44 + 1) * iVar3 + local_44 + 1];
        if (0.0 < dVar17 * dVar17 + dVar18 * dVar18) {
          local_108 = sqrt(dVar17 * dVar17 + dVar18 * dVar18);
        }
        else {
          local_108 = 0.0;
        }
        dVar17 = dVar17 / local_108;
        dVar18 = dVar18 / local_108;
        pdVar13[(local_44 + 1) * iVar3 + local_44] = local_108;
        pdVar13[(local_44 + 1) * iVar3 + local_44 + 1] = 0.0;
        if (local_44 < iVar3 + -1) {
          for (local_48 = local_44 + 2; local_48 < iVar3; local_48 = local_48 + 1) {
            dVar1 = pdVar13[local_48 * iVar3 + local_44];
            dVar2 = pdVar13[local_48 * iVar3 + local_44 + 1];
            pdVar13[local_48 * iVar3 + local_44 + 1] = -dVar18 * dVar1 + dVar17 * dVar2;
            pdVar13[local_48 * iVar3 + local_44] = dVar17 * dVar1 + dVar18 * dVar2;
          }
        }
        N_VLinearSum(dVar17,dVar18,*(undefined8 *)(lVar10 + (long)local_44 * 8),
                     *(undefined8 *)(lVar10 + (long)(local_44 + 1) * 8),in_RDX);
        N_VLinearSum(-dVar18,dVar17,*(undefined8 *)(lVar10 + (long)local_44 * 8),
                     *(undefined8 *)(lVar10 + (long)(local_44 + 1) * 8),
                     *(undefined8 *)(lVar10 + (long)(local_44 + 1) * 8));
        N_VScale(0x3ff0000000000000,in_RDX,*(undefined8 *)(lVar10 + (long)local_44 * 8));
      }
      for (local_44 = 1; local_44 < iVar3; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < iVar3 + -1; local_48 = local_48 + 1) {
          pdVar13[(local_44 + -1) * iVar3 + local_48] = pdVar13[local_44 * iVar3 + local_48];
        }
      }
      N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar8 + (long)iVar16 * 8),in_RDX);
      for (local_48 = 0; local_48 < iVar3 + -1; local_48 = local_48 + 1) {
        dVar17 = (double)N_VDotProd(*(undefined8 *)(lVar10 + (long)local_48 * 8),in_RDX);
        pdVar13[(iVar3 + -1) * iVar3 + local_48] = dVar17;
        N_VLinearSum(0x3ff0000000000000,-pdVar13[(iVar3 + -1) * iVar3 + local_48],in_RDX,
                     *(undefined8 *)(lVar10 + (long)local_48 * 8),in_RDX);
      }
      dVar17 = (double)N_VDotProd(in_RDX,in_RDX);
      pdVar13[(iVar3 + -1) * iVar3 + iVar3 + -1] = dVar17;
      if (0.0 < pdVar13[(iVar3 + -1) * iVar3 + iVar3 + -1]) {
        local_110 = sqrt(pdVar13[(iVar3 + -1) * iVar3 + iVar3 + -1]);
      }
      else {
        local_110 = 0.0;
      }
      pdVar13[(iVar3 + -1) * iVar3 + iVar3 + -1] = local_110;
      N_VScale(1.0 / pdVar13[(iVar3 + -1) * iVar3 + iVar3 + -1],in_RDX,
               *(undefined8 *)(lVar10 + (long)(iVar3 + -1) * 8));
      local_48 = 0;
      local_44 = iVar16;
      while (local_44 = local_44 + 1, local_44 < iVar3) {
        puVar5[local_48] = local_44;
        local_48 = local_48 + 1;
      }
      for (local_44 = 0; local_44 < iVar16 + 1; local_44 = local_44 + 1) {
        puVar5[local_48] = local_44;
        local_48 = local_48 + 1;
      }
    }
    else {
      N_VScale(0x3ff0000000000000,*(undefined8 *)(lVar8 + (long)iVar16 * 8),in_RDX);
      for (local_48 = 0; local_48 < in_R8D + -1; local_48 = local_48 + 1) {
        puVar5[local_48] = local_48;
        dVar17 = (double)N_VDotProd(*(undefined8 *)(lVar10 + (long)local_48 * 8),in_RDX);
        pdVar13[(in_R8D + -1) * iVar3 + local_48] = dVar17;
        N_VLinearSum(0x3ff0000000000000,-pdVar13[(in_R8D + -1) * iVar3 + local_48],in_RDX,
                     *(undefined8 *)(lVar10 + (long)local_48 * 8),in_RDX);
      }
      dVar17 = (double)N_VDotProd(in_RDX,in_RDX);
      pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1] = dVar17;
      if (0.0 < pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1]) {
        local_100 = sqrt(pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1]);
      }
      else {
        local_100 = 0.0;
      }
      pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1] = local_100;
      if ((pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1] != 0.0) ||
         (NAN(pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1]))) {
        N_VScale(1.0 / pdVar13[(in_R8D + -1) * iVar3 + in_R8D + -1],in_RDX,
                 *(undefined8 *)(lVar10 + (long)iVar16 * 8));
      }
      else {
        N_VScale(in_RDX,*(undefined8 *)(lVar10 + (long)iVar16 * 8));
      }
      puVar5[in_R8D + -1] = in_R8D + -1;
    }
    local_4c = in_R8D;
    if (iVar3 < in_R8D) {
      local_4c = iVar3;
    }
    N_VDotProdMulti(local_4c,uVar15,lVar10,lVar14);
    *puVar11 = 0x3ff0000000000000;
    *puVar12 = in_RSI;
    local_3c = 1;
    local_48 = local_4c;
    while (local_44 = local_48 + -1, -1 < local_44) {
      for (; local_48 < local_4c; local_48 = local_48 + 1) {
        *(double *)(lVar14 + (long)local_44 * 8) =
             -pdVar13[local_48 * iVar3 + local_44] * *(double *)(lVar14 + (long)local_48 * 8) +
             *(double *)(lVar14 + (long)local_44 * 8);
      }
      dVar17 = *(double *)(lVar14 + (long)local_44 * 8);
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        *(double *)(lVar14 + (long)local_44 * 8) =
             *(double *)(lVar14 + (long)local_44 * 8) / pdVar13[local_44 * iVar3 + local_44];
      }
      else {
        *(undefined8 *)(lVar14 + (long)local_44 * 8) = 0;
      }
      puVar11[local_3c] = *(ulong *)(lVar14 + (long)local_44 * 8) ^ 0x8000000000000000;
      puVar12[local_3c] = *(undefined8 *)(lVar9 + (long)(int)puVar5[local_44] * 8);
      local_3c = local_3c + 1;
      local_48 = local_44;
    }
    if (iVar4 != 0) {
      dVar19 = 1.0 - dVar19;
      puVar11[local_3c] = -dVar19;
      puVar12[local_3c] = uVar15;
      while( true ) {
        local_3c = local_3c + 1;
        local_44 = local_4c + -1;
        if (local_44 < 0) break;
        puVar11[local_3c] = dVar19 * *(double *)(lVar14 + (long)local_44 * 8);
        puVar12[local_3c] = *(undefined8 *)(lVar8 + (long)(int)puVar5[local_44] * 8);
        local_4c = local_44;
      }
    }
    N_VLinearCombination(local_3c,puVar11,puVar12,in_RDX);
  }
  return 0;
}

Assistant:

static SUNErrCode AndersonAccelerate(SUNNonlinearSolver NLS, N_Vector gval,
                                     N_Vector x, N_Vector xold, int iter)
{
  SUNFunctionBegin(NLS->sunctx);
  /* local variables */
  int nvec, i_pt, i, j, lAA, maa, *ipt_map;
  sunrealtype a, b, rtemp, c, s, beta, onembeta, *cvals, *R, *gamma;
  N_Vector fv, vtemp, gold, fold, *df, *dg, *Q, *Xvecs;
  sunbooleantype damping;

  /* local shortcut variables */
  vtemp   = x; /* use result as temporary vector */
  ipt_map = FP_CONTENT(NLS)->imap;
  maa     = FP_CONTENT(NLS)->m;
  gold    = FP_CONTENT(NLS)->gold;
  fold    = FP_CONTENT(NLS)->fold;
  df      = FP_CONTENT(NLS)->df;
  dg      = FP_CONTENT(NLS)->dg;
  Q       = FP_CONTENT(NLS)->q;
  cvals   = FP_CONTENT(NLS)->cvals;
  Xvecs   = FP_CONTENT(NLS)->Xvecs;
  R       = FP_CONTENT(NLS)->R;
  gamma   = FP_CONTENT(NLS)->gamma;
  fv      = FP_CONTENT(NLS)->delta;
  damping = FP_CONTENT(NLS)->damping;
  beta    = FP_CONTENT(NLS)->beta;

  /* reset ipt_map, i_pt */
  for (i = 0; i < maa; i++) { ipt_map[i] = 0; }
  i_pt = iter - 1 - ((iter - 1) / maa) * maa;

  /* update dg[i_pt], df[i_pt], fv, gold and fold*/
  N_VLinearSum(ONE, gval, -ONE, xold, fv);
  SUNCheckLastErr();
  if (iter > 0)
  {
    N_VLinearSum(ONE, gval, -ONE, gold, dg[i_pt]);
    SUNCheckLastErr(); /* dg_new = gval - gold */
    N_VLinearSum(ONE, fv, -ONE, fold, df[i_pt]);
    SUNCheckLastErr(); /* df_new = fv - fold */
  }
  N_VScale(ONE, gval, gold);
  SUNCheckLastErr();
  N_VScale(ONE, fv, fold);
  SUNCheckLastErr();

  /* on first iteration, just do basic fixed-point update */
  if (iter == 0)
  {
    N_VScale(ONE, gval, x);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* update data structures based on current iteration index */

  if (iter == 1)
  { /* second iteration */

    R[0] = N_VDotProd(df[i_pt], df[i_pt]);
    SUNCheckLastErr();
    R[0] = SUNRsqrt(R[0]);
    N_VScale(ONE / R[0], df[i_pt], Q[i_pt]);
    SUNCheckLastErr();
    ipt_map[0] = 0;
  }
  else if (iter <= maa)
  { /* another iteration before we've reached maa */

    N_VScale(ONE, df[i_pt], vtemp);
    SUNCheckLastErr();
    for (j = 0; j < iter - 1; j++)
    {
      ipt_map[j]              = j;
      R[(iter - 1) * maa + j] = N_VDotProd(Q[j], vtemp);
      SUNCheckLastErr();
      N_VLinearSum(ONE, vtemp, -R[(iter - 1) * maa + j], Q[j], vtemp);
      SUNCheckLastErr();
    }
    R[(iter - 1) * maa + iter - 1] = N_VDotProd(vtemp, vtemp);
    SUNCheckLastErr();
    R[(iter - 1) * maa + iter - 1] = SUNRsqrt(R[(iter - 1) * maa + iter - 1]);
    if (R[(iter - 1) * maa + iter - 1] == ZERO)
    {
      N_VScale(ZERO, vtemp, Q[i_pt]);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale((ONE / R[(iter - 1) * maa + iter - 1]), vtemp, Q[i_pt]);
      SUNCheckLastErr();
    }
    ipt_map[iter - 1] = iter - 1;
  }
  else
  { /* we've filled the acceleration subspace, so start recycling */

    /* delete left-most column vector from QR factorization */
    for (i = 0; i < maa - 1; i++)
    {
      a                        = R[(i + 1) * maa + i];
      b                        = R[(i + 1) * maa + i + 1];
      rtemp                    = SUNRsqrt(a * a + b * b);
      c                        = a / rtemp;
      s                        = b / rtemp;
      R[(i + 1) * maa + i]     = rtemp;
      R[(i + 1) * maa + i + 1] = ZERO;
      if (i < maa - 1)
      {
        for (j = i + 2; j < maa; j++)
        {
          a                  = R[j * maa + i];
          b                  = R[j * maa + i + 1];
          rtemp              = c * a + s * b;
          R[j * maa + i + 1] = -s * a + c * b;
          R[j * maa + i]     = rtemp;
        }
      }
      N_VLinearSum(c, Q[i], s, Q[i + 1], vtemp);
      SUNCheckLastErr();
      N_VLinearSum(-s, Q[i], c, Q[i + 1], Q[i + 1]);
      SUNCheckLastErr();
      N_VScale(ONE, vtemp, Q[i]);
      SUNCheckLastErr();
    }

    /* ahift R to the left by one */
    for (i = 1; i < maa; i++)
    {
      for (j = 0; j < maa - 1; j++) { R[(i - 1) * maa + j] = R[i * maa + j]; }
    }

    /* add the new df vector */
    N_VScale(ONE, df[i_pt], vtemp);
    SUNCheckLastErr();
    for (j = 0; j < maa - 1; j++)
    {
      R[(maa - 1) * maa + j] = N_VDotProd(Q[j], vtemp);
      SUNCheckLastErr();
      N_VLinearSum(ONE, vtemp, -R[(maa - 1) * maa + j], Q[j], vtemp);
      SUNCheckLastErr();
    }
    R[(maa - 1) * maa + maa - 1] = N_VDotProd(vtemp, vtemp);
    SUNCheckLastErr();
    R[(maa - 1) * maa + maa - 1] = SUNRsqrt(R[(maa - 1) * maa + maa - 1]);
    N_VScale((ONE / R[(maa - 1) * maa + maa - 1]), vtemp, Q[maa - 1]);
    SUNCheckLastErr();

    /* update the iteration map */
    j = 0;
    for (i = i_pt + 1; i < maa; i++) { ipt_map[j++] = i; }
    for (i = 0; i < i_pt + 1; i++) { ipt_map[j++] = i; }
  }

  /* solve least squares problem and update solution */
  lAA = iter;
  if (maa < iter) { lAA = maa; }
  SUNCheckCall(N_VDotProdMulti(lAA, fv, Q, gamma));

  /* set arrays for fused vector operation */
  cvals[0] = ONE;
  Xvecs[0] = gval;
  nvec     = 1;
  for (i = lAA - 1; i > -1; i--)
  {
    for (j = i + 1; j < lAA; j++) { gamma[i] -= R[j * maa + i] * gamma[j]; }
    if (gamma[i] == ZERO) { gamma[i] = ZERO; }
    else { gamma[i] /= R[i * maa + i]; }
    cvals[nvec] = -gamma[i];
    Xvecs[nvec] = dg[ipt_map[i]];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (damping)
  {
    onembeta    = (ONE - beta);
    cvals[nvec] = -onembeta;
    Xvecs[nvec] = fv;
    nvec += 1;
    for (i = lAA - 1; i > -1; i--)
    {
      cvals[nvec] = onembeta * gamma[i];
      Xvecs[nvec] = df[ipt_map[i]];
      nvec += 1;
    }
  }

  /* update solution */
  SUNCheckCall(N_VLinearCombination(nvec, cvals, Xvecs, x));

  return SUN_SUCCESS;
}